

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccgen.c
# Opt level: O3

Sym * sym_push2(Sym **ps,int v,int t,int c)

{
  Sym *data;
  Sym *pSVar1;
  int iVar2;
  Sym *pSVar3;
  
  if (sym_free_first == (Sym *)0x0) {
    data = (Sym *)tcc_malloc(0x1ff0);
    dynarray_add(&sym_pools,&nb_sym_pools,data);
    pSVar1 = data + -1;
    iVar2 = 0x92;
    do {
      pSVar3 = sym_free_first;
      pSVar1[1].field_5.next = pSVar3;
      pSVar1 = pSVar1 + 1;
      iVar2 = iVar2 + -1;
      sym_free_first = data;
      data = data + 1;
    } while (iVar2 != 0);
  }
  else {
    pSVar3 = (sym_free_first->field_5).next;
    pSVar1 = sym_free_first;
  }
  sym_free_first = pSVar3;
  pSVar1->v = 0;
  pSVar1->r = 0;
  pSVar1->a = (SymAttr)0x0;
  (pSVar1->field_3).enum_val = 0;
  *(undefined8 *)&pSVar1->type = 0;
  (pSVar1->type).ref = (Sym *)0x0;
  (pSVar1->field_5).next = (Sym *)0x0;
  pSVar1->prev = (Sym *)0x0;
  pSVar1->prev_tok = (Sym *)0x0;
  pSVar1->v = v;
  (pSVar1->type).t = t;
  (pSVar1->field_3).field_0.c = c;
  pSVar1->prev = *ps;
  *ps = pSVar1;
  return pSVar1;
}

Assistant:

ST_FUNC Sym* sym_push2(Sym** ps, int v, int t, int c) {
  Sym* s;

  s = sym_malloc();
  memset(s, 0, sizeof *s);
  s->v = v;
  s->type.t = t;
  s->c = c;
  /* add in stack */
  s->prev = *ps;
  *ps = s;
  return s;
}